

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommandArgumentParserHelper.cxx
# Opt level: O2

char * __thiscall
cmCommandArgumentParserHelper::ExpandVariable(cmCommandArgumentParserHelper *this,char *var)

{
  cmMakefile *pcVar1;
  int iVar2;
  string *str;
  char *pcVar3;
  cmListFileContext *pcVar4;
  string_view str_00;
  string line;
  cmListFileBacktrace bt;
  string local_78;
  undefined1 local_58 [16];
  string local_48;
  static_string_view local_28;
  
  if (var == (char *)0x0) {
    return (char *)0x0;
  }
  if ((this->FileLine < 0) || (iVar2 = strcmp(var,"CMAKE_CURRENT_LIST_LINE"), iVar2 != 0)) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,var,(allocator<char> *)(local_58 + 0x10));
    str = (string *)cmMakefile::GetDefinition(pcVar1,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if (str == (string *)0x0) {
      pcVar1 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,var,(allocator<char> *)(local_58 + 0x10));
      cmMakefile::MaybeWarnUninitialized(pcVar1,&local_78,this->FileName);
      std::__cxx11::string::~string((string *)&local_78);
      if (this->RemoveEmpty == false) {
        return (char *)0x0;
      }
      str = &cmValue::Empty_abi_cxx11_;
    }
    else if (this->EscapeQuotes == true) {
      str_00._M_str = (str->_M_dataplus)._M_p;
      str_00._M_len = str->_M_string_length;
      cmEscapeQuotes_abi_cxx11_(&local_78,str_00);
      pcVar3 = AddString(this,&local_78);
      goto LAB_004088b6;
    }
    pcVar3 = AddString(this,str);
  }
  else {
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    local_78._M_string_length = 0;
    local_78.field_2._M_local_buf[0] = '\0';
    cmMakefile::GetBacktrace((cmMakefile *)local_58);
    pcVar4 = cmConstStack<cmListFileContext,_cmListFileBacktrace>::Top
                       ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)local_58);
    if ((pcVar4->DeferId).
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        ._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      local_28.super_string_view._M_len = 9;
      local_28.super_string_view._M_str = "DEFERRED:";
      cmStrCat<cm::static_string_view,std::__cxx11::string_const&>
                ((string *)(local_58 + 0x10),(static_string_view *)(local_58 + 0x30),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &pcVar4->DeferId);
    }
    else {
      std::__cxx11::to_string((string *)(local_58 + 0x10),this->FileLine);
    }
    std::__cxx11::string::operator=((string *)&local_78,(string *)(local_58 + 0x10));
    std::__cxx11::string::~string((string *)(local_58 + 0x10));
    pcVar3 = AddString(this,&local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
LAB_004088b6:
    std::__cxx11::string::~string((string *)&local_78);
  }
  return pcVar3;
}

Assistant:

const char* cmCommandArgumentParserHelper::ExpandVariable(const char* var)
{
  if (!var) {
    return nullptr;
  }
  if (this->FileLine >= 0 && strcmp(var, "CMAKE_CURRENT_LIST_LINE") == 0) {
    std::string line;
    cmListFileBacktrace bt = this->Makefile->GetBacktrace();
    cmListFileContext const& top = bt.Top();
    if (top.DeferId) {
      line = cmStrCat("DEFERRED:"_s, *top.DeferId);
    } else {
      line = std::to_string(this->FileLine);
    }
    return this->AddString(line);
  }
  cmValue value = this->Makefile->GetDefinition(var);
  if (!value) {
    this->Makefile->MaybeWarnUninitialized(var, this->FileName);
    if (!this->RemoveEmpty) {
      return nullptr;
    }
  }
  if (this->EscapeQuotes && value) {
    return this->AddString(cmEscapeQuotes(*value));
  }
  return this->AddString(value);
}